

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-proxy.c
# Opt level: O0

Socket * platform_new_connection
                   (SockAddr *addr,char *hostname,int port,_Bool privport,_Bool oobinline,
                   _Bool nodelay,_Bool keepalive,Plug *plug,Conf *conf,Interactor *itr)

{
  int iVar1;
  int infd_00;
  DeferredSocketOpener *opener_00;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  Socket *toret;
  int infd;
  int outfd;
  char *cmd;
  Socket *socket;
  DeferredSocketOpener *opener;
  _Bool keepalive_local;
  _Bool nodelay_local;
  _Bool oobinline_local;
  _Bool privport_local;
  int port_local;
  char *hostname_local;
  SockAddr *addr_local;
  
  iVar1 = conf_get_int(conf,0xd);
  if (iVar1 == 5) {
    opener_00 = local_proxy_opener(addr,port,plug,conf,itr);
    addr_local = (SockAddr *)make_deferred_fd_socket(opener_00,addr,port,plug);
    local_proxy_opener_set_socket(opener_00,(Socket *)addr_local);
  }
  else if (iVar1 == 9) {
    pcVar2 = format_telnet_command(addr,port,conf,(uint *)0x0);
    iVar1 = open("/dev/null",1);
    if (iVar1 == -1) {
      safefree(pcVar2);
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      addr_local = (SockAddr *)new_error_socket_fmt(plug,"/dev/null: %s",pcVar2);
    }
    else {
      infd_00 = open(pcVar2,0);
      if (infd_00 == -1) {
        piVar3 = __errno_location();
        pcVar4 = strerror(*piVar3);
        addr_local = (SockAddr *)new_error_socket_fmt(plug,"%s: %s",pcVar2,pcVar4);
        safefree(pcVar2);
        close(iVar1);
      }
      else {
        safefree(pcVar2);
        addr_local = (SockAddr *)make_fd_socket(infd_00,iVar1,-1,addr,port,plug);
      }
    }
  }
  else {
    addr_local = (SockAddr *)0x0;
  }
  return (Socket *)addr_local;
}

Assistant:

Socket *platform_new_connection(SockAddr *addr, const char *hostname,
                                int port, bool privport,
                                bool oobinline, bool nodelay, bool keepalive,
                                Plug *plug, Conf *conf, Interactor *itr)
{
    switch (conf_get_int(conf, CONF_proxy_type)) {
      case PROXY_CMD: {
        DeferredSocketOpener *opener = local_proxy_opener(
            addr, port, plug, conf, itr);
        Socket *socket = make_deferred_fd_socket(opener, addr, port, plug);
        local_proxy_opener_set_socket(opener, socket);
        return socket;
      }

      case PROXY_FUZZ: {
        char *cmd = format_telnet_command(addr, port, conf, NULL);
        int outfd = open("/dev/null", O_WRONLY);
        if (outfd == -1) {
            sfree(cmd);
            return new_error_socket_fmt(
                plug, "/dev/null: %s", strerror(errno));
        }
        int infd = open(cmd, O_RDONLY);
        if (infd == -1) {
            Socket *toret = new_error_socket_fmt(
                plug, "%s: %s", cmd, strerror(errno));
            sfree(cmd);
            close(outfd);
            return toret;
        }
        sfree(cmd);
        return make_fd_socket(infd, outfd, -1, addr, port, plug);
      }

      default:
        return NULL;
    }
}